

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtExternalObject.cpp
# Opt level: O3

void __thiscall JsrtExternalObject::Finalize(JsrtExternalObject *this,bool isShutdown)

{
  Type *pTVar1;
  RecyclableObject *pRVar2;
  code *pcVar3;
  bool bVar4;
  void *pvVar5;
  undefined4 *puVar6;
  undefined1 local_28 [8];
  JsrtCallbackState scope;
  
  pTVar1 = (this->super_DynamicObject).super_RecyclableObject.type.ptr;
  pRVar2 = pTVar1[1].prototype.ptr;
  if (pTVar1[1].entryPoint == (Type)0x0 && pRVar2 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalObject.cpp"
                       ,0xc6,
                       "(this->GetExternalType()->GetJsTraceCallback() != nullptr || finalizeCallback != nullptr)"
                       ,
                       "this->GetExternalType()->GetJsTraceCallback() != nullptr || finalizeCallback != nullptr"
                      );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  else if (pRVar2 != (RecyclableObject *)0x0) {
    JsrtCallbackState::JsrtCallbackState((JsrtCallbackState *)local_28,(ThreadContext *)0x0);
    pvVar5 = GetSlotData(this);
    (*(code *)pRVar2)(pvVar5);
    JsrtCallbackState::~JsrtCallbackState((JsrtCallbackState *)local_28);
  }
  return;
}

Assistant:

void JsrtExternalObject::Finalize(bool isShutdown)
{
    JsFinalizeCallback finalizeCallback = this->GetExternalType()->GetJsFinalizeCallback();
#ifdef _CHAKRACOREBUILD
    Assert(this->GetExternalType()->GetJsTraceCallback() != nullptr || finalizeCallback != nullptr);
#else
    Assert(finalizeCallback != nullptr);
#endif
    if (nullptr != finalizeCallback)
    {
        JsrtCallbackState scope(nullptr);
        finalizeCallback(this->GetSlotData());
    }
}